

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matte.cpp
# Opt level: O3

MatteMaterial * phyr::createMatteMaterial(double Kd,double sigma)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  MatteMaterial *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> local_208;
  shared_ptr<phyr::Texture<double>_> local_1f8 [30];
  
  lVar1 = 0;
  do {
    (&local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    [lVar1] = (element_type *)Kd;
    (&local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    )[lVar1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Kd;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x3c);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x1f8);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a9db8;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_evaluate_001a9e08;
  memcpy(&p_Var2[1]._M_use_count,local_1f8,0x1e0);
  local_208.super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var2 + 1);
  local_208.super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a9e58;
  local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR_evaluate_001a9ea8;
  *(double *)
   &local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = sigma;
  this = (MatteMaterial *)operator_new(0x28);
  MatteMaterial::MatteMaterial(this,&local_208,local_1f8);
  if (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8[0].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.
               super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return this;
}

Assistant:

MatteMaterial* createMatteMaterial(Real Kd, Real sigma) {
    std::shared_ptr<Texture<Spectrum>> kd =
            std::make_shared<ConstantTexture<Spectrum>>(Spectrum(Kd));
    std::shared_ptr<Texture<Real>> _sigma =
            std::make_shared<ConstantTexture<Real>>(sigma);

    return new MatteMaterial(kd, _sigma);
}